

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_validate_r
              (pfx_table *pfx_table,pfx_record **reason,uint *reason_len,uint32_t asn,
              lrtr_ip_addr *prefix,uint8_t prefix_len,pfxv_state *result)

{
  pthread_rwlock_t *__rwlock;
  uint32_t uVar1;
  long lVar2;
  lrtr_ip_addr prefix_00;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  trie_node *node;
  pfx_record *ppVar6;
  ulong uVar7;
  uint8_t from;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff7c;
  uint lvl;
  lrtr_ip_addr local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    lrtr_dbg("PFX: TRYING TO VALIDATE A PREFIX BUT NO TABLE INITIALIZED");
LAB_00105361:
    iVar5 = -1;
  }
  else {
    __rwlock = &pfx_table->lock;
    pthread_rwlock_rdlock((pthread_rwlock_t *)__rwlock);
    if ((&pfx_table->ipv4)[prefix->ver != LRTR_IPV4] != (trie_node *)0x0) {
      lvl = 0;
      node = trie_lookup((&pfx_table->ipv4)[prefix->ver != LRTR_IPV4],prefix,prefix_len,&lvl);
      if (node != (trie_node *)0x0) {
        if (reason == (pfx_record **)0x0 || reason_len == (uint *)0x0) goto LAB_00105223;
        uVar8 = *node->data;
        *reason_len = uVar8;
        ppVar6 = (pfx_record *)lrtr_realloc(*reason,(ulong)uVar8 * 0x28);
        *reason = ppVar6;
        if (ppVar6 == (pfx_record *)0x0) {
          pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        }
        else {
          uVar8 = *reason_len;
          while (iVar5 = pfx_table_node2pfx_record(node,ppVar6,uVar8), iVar5 != -1) {
LAB_00105223:
            do {
              uVar7 = (ulong)*node->data;
              lVar10 = 4;
              for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
                lVar2 = *(long *)((long)node->data + 8);
                uVar1 = *(uint32_t *)(lVar2 + -4 + lVar10);
                if ((uVar1 == asn && uVar1 != 0) && (prefix_len <= *(byte *)(lVar2 + lVar10))) {
                  if (uVar9 < uVar7) {
                    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
                    *result = BGP_PFXV_STATE_VALID;
                    goto LAB_001051fb;
                  }
                  break;
                }
                lVar10 = lVar10 + 0x10;
              }
              from = (uint8_t)lvl;
              lvl = lvl + 1;
              lrtr_ip_addr_get_bits(&local_50,prefix,from,'\x01');
              prefix_00.u.addr6.addr[1] = local_50.u.addr6.addr[3];
              prefix_00._0_8_ = local_50.u._4_8_;
              prefix_00.u._8_8_ = in_stack_ffffffffffffff7c;
              _Var3 = lrtr_ip_addr_is_zero(prefix_00);
              node = trie_lookup((&node->rchild)[_Var3],prefix,prefix_len,&lvl);
              if (node == (trie_node *)0x0) {
                pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
                *result = BGP_PFXV_STATE_INVALID;
                goto LAB_001051fb;
              }
            } while (reason == (pfx_record **)0x0 || reason_len == (uint *)0x0);
            uVar8 = *reason_len;
            uVar4 = *node->data + uVar8;
            *reason_len = uVar4;
            ppVar6 = (pfx_record *)lrtr_realloc(*reason,(ulong)uVar4 * 0x28);
            *reason = ppVar6;
            if (ppVar6 == (pfx_record *)0x0) break;
            ppVar6 = ppVar6 + uVar8;
            uVar8 = *node->data;
          }
          pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        }
        pfx_table_free_reason(reason,reason_len);
        goto LAB_00105361;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    *result = BGP_PFXV_STATE_NOT_FOUND;
    pfx_table_free_reason(reason,reason_len);
LAB_001051fb:
    iVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

RTRLIB_EXPORT int pfx_table_validate_r(struct pfx_table *pfx_table, struct pfx_record **reason,
				       unsigned int *reason_len, const uint32_t asn, const struct lrtr_ip_addr *prefix,
				       const uint8_t prefix_len, enum pfxv_state *result)
{
	// assert(reason_len == NULL || *reason_len  == 0);
	// assert(reason == NULL || *reason == NULL);

	if (pfx_table == NULL) {
		PFX_DBG1("TRYING TO VALIDATE A PREFIX BUT NO TABLE INITIALIZED");
		return PFX_ERROR;
	}

	pthread_rwlock_rdlock(&(pfx_table->lock));
	struct trie_node *root = pfx_table_get_root(pfx_table, prefix->ver);

	if (!root) {
		pthread_rwlock_unlock(&pfx_table->lock);
		*result = BGP_PFXV_STATE_NOT_FOUND;
		pfx_table_free_reason(reason, reason_len);
		return PFX_SUCCESS;
	}

	unsigned int lvl = 0;
	struct trie_node *node = trie_lookup(root, prefix, prefix_len, &lvl);

	if (!node) {
		pthread_rwlock_unlock(&pfx_table->lock);
		*result = BGP_PFXV_STATE_NOT_FOUND;
		pfx_table_free_reason(reason, reason_len);
		return PFX_SUCCESS;
	}

	if (reason_len && reason) {
		*reason_len = ((struct node_data *)node->data)->len;
		*reason = lrtr_realloc(*reason, *reason_len * sizeof(struct pfx_record));
		if (!*reason) {
			pthread_rwlock_unlock(&pfx_table->lock);
			pfx_table_free_reason(reason, reason_len);
			return PFX_ERROR;
		}
		if (pfx_table_node2pfx_record(node, *reason, *reason_len) == PFX_ERROR) {
			pthread_rwlock_unlock(&pfx_table->lock);
			pfx_table_free_reason(reason, reason_len);
			return PFX_ERROR;
		}
	}

	while (!pfx_table_elem_matches(node->data, asn, prefix_len)) {
		if (lrtr_ip_addr_is_zero(lrtr_ip_addr_get_bits(
			    prefix, lvl++,
			    1))) //post-incr lvl, trie_lookup is performed on child_nodes => parent lvl + 1
			node = trie_lookup(node->lchild, prefix, prefix_len, &lvl);
		else
			node = trie_lookup(node->rchild, prefix, prefix_len, &lvl);

		if (!node) {
			pthread_rwlock_unlock(&pfx_table->lock);
			*result = BGP_PFXV_STATE_INVALID;
			return PFX_SUCCESS;
		}

		if (reason_len && reason) {
			unsigned int r_len_old = *reason_len;
			*reason_len += ((struct node_data *)node->data)->len;
			*reason = lrtr_realloc(*reason, *reason_len * sizeof(struct pfx_record));
			struct pfx_record *start = *reason + r_len_old;

			if (!*reason) {
				pthread_rwlock_unlock(&pfx_table->lock);
				pfx_table_free_reason(reason, reason_len);
				return PFX_ERROR;
			}
			if (pfx_table_node2pfx_record(node, start, ((struct node_data *)node->data)->len) ==
			    PFX_ERROR) {
				pthread_rwlock_unlock(&pfx_table->lock);
				pfx_table_free_reason(reason, reason_len);
				return PFX_ERROR;
			}
		}
	}

	pthread_rwlock_unlock(&pfx_table->lock);
	*result = BGP_PFXV_STATE_VALID;
	return PFX_SUCCESS;
}